

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

size_t absl::lts_20250127::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,google::protobuf::internal::DescriptorTable_const*>
                 (void *fn,void *slot)

{
  size_t sVar1;
  
  sVar1 = google::protobuf::anon_unknown_19::GeneratedMessageFactory::DescriptorByNameHash::
          operator()(*slot,(DescriptorTable *)slot);
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}